

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io.cpp
# Opt level: O2

shared_ptr<dap::Reader> __thiscall
dap::spy(dap *this,shared_ptr<dap::Reader> *r,shared_ptr<dap::Writer> *s,char *prefix)

{
  pointer p_Var1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp;
  shared_ptr<dap::Reader> sVar2;
  __allocator_type __a2;
  allocator<char> local_69;
  __allocated_ptr<std::allocator<std::_Sp_counted_ptr_inplace<(anonymous_namespace)::ReaderSpy,_std::allocator<(anonymous_namespace)::ReaderSpy>,_(__gnu_cxx::_Lock_policy)2>_>_>
  local_68;
  string local_58 [32];
  undefined8 local_38;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_30;
  
  p_Var1 = (pointer)operator_new(0x58);
  local_68._M_alloc = &__a2;
  (p_Var1->super__Sp_counted_base<(__gnu_cxx::_Lock_policy)2>)._M_use_count = 1;
  (p_Var1->super__Sp_counted_base<(__gnu_cxx::_Lock_policy)2>)._M_weak_count = 1;
  (p_Var1->super__Sp_counted_base<(__gnu_cxx::_Lock_policy)2>)._vptr__Sp_counted_base =
       (_func_int **)&PTR___Sp_counted_ptr_inplace_009a02b8;
  local_68._M_ptr = p_Var1;
  std::__cxx11::string::string<std::allocator<char>>(local_58,prefix,&local_69);
  (p_Var1->_M_impl)._M_storage._M_storage.__align =
       (anon_struct_8_0_00000001_for___align)&PTR__ReaderSpy_009a0328;
  std::__shared_ptr<dap::Reader,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<dap::Reader,_(__gnu_cxx::_Lock_policy)2> *)
             ((long)&(p_Var1->_M_impl)._M_storage._M_storage + 8),
             &r->super___shared_ptr<dap::Reader,_(__gnu_cxx::_Lock_policy)2>);
  std::__shared_ptr<dap::Writer,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<dap::Writer,_(__gnu_cxx::_Lock_policy)2> *)
             ((long)&(p_Var1->_M_impl)._M_storage._M_storage + 0x18),
             &s->super___shared_ptr<dap::Writer,_(__gnu_cxx::_Lock_policy)2>);
  std::__cxx11::string::string
            ((string *)((p_Var1->_M_impl)._M_storage._M_storage.__data + 0x28),local_58);
  std::__cxx11::string::~string(local_58);
  local_68._M_ptr = (pointer)0x0;
  std::
  __allocated_ptr<std::allocator<std::_Sp_counted_ptr_inplace<(anonymous_namespace)::ReaderSpy,_std::allocator<(anonymous_namespace)::ReaderSpy>,_(__gnu_cxx::_Lock_policy)2>_>_>
  ::~__allocated_ptr(&local_68);
  *(_Impl **)this = &p_Var1->_M_impl;
  local_30._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  *(pointer *)(this + 8) = p_Var1;
  local_38 = 0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_30);
  sVar2.super___shared_ptr<dap::Reader,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar2.super___shared_ptr<dap::Reader,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (shared_ptr<dap::Reader>)sVar2.super___shared_ptr<dap::Reader,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<Reader> spy(const std::shared_ptr<Reader>& r,
                            const std::shared_ptr<Writer>& s,
                            const char* prefix /* = "\n<-" */) {
  return std::make_shared<ReaderSpy>(r, s, prefix);
}